

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
cs::instance_type::parse_define_var(instance_type *this,iterator it,bool constant,bool link)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  int iVar3;
  token_base **pptVar4;
  runtime_error *this_00;
  _func_int **pp_Var5;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var6;
  var local_78;
  iterator local_70;
  iterator it_local;
  size_t local_60;
  any local_58;
  _Alloc_hider local_50;
  
  it_local = it;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar1 = *pptVar4;
  if (iVar3 == 0xf) {
    pp_Var6 = ptVar1[2]._vptr_token_base;
    pp_Var5 = ptVar1[3]._vptr_token_base;
    local_60 = ptVar1[3].line_num;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    while (pp_Var6 != pp_Var2) {
      parse_define_var(this,(tree_node *)*pp_Var6,constant,link);
      pp_Var6 = pp_Var6 + 1;
      if (pp_Var6 == pp_Var5) {
        pp_Var6 = *(_func_int ***)(local_60 + 8);
        local_60 = local_60 + 8;
        pp_Var5 = pp_Var6 + 0x40;
      }
    }
  }
  else if (*(int *)&ptVar1[1]._vptr_token_base == 0x35) {
    parse_define_structured_binding(this,it_local,constant,link);
  }
  else {
    if (*(int *)&ptVar1[1]._vptr_token_base != 0x11) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb0,"Wrong grammar for variable definition(6).",
                 (allocator *)&local_70);
      runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffb0);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_70 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    if (constant) {
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_70);
      local_50._M_p = (pointer)(*pptVar4)[1]._vptr_token_base;
      if ((proxy *)local_50._M_p != (proxy *)0x0) {
        ((proxy *)local_50._M_p)->refcount = ((proxy *)local_50._M_p)->refcount + 1;
      }
    }
    else {
      runtime_type::parse_expr
                ((runtime_type *)&stack0xffffffffffffffb0,(iterator *)this,SUB81(&local_70,0));
    }
    local_70 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_70);
    ptVar1 = *pptVar4;
    if (link || constant) {
      if ((proxy *)local_50._M_p != (proxy *)0x0) {
        *(_func_int **)(local_50._M_p + 8) = *(_func_int **)(local_50._M_p + 8) + 1;
      }
      local_78.mDat = (proxy *)local_50._M_p;
    }
    else {
      if ((proxy *)local_50._M_p != (proxy *)0x0) {
        *(_func_int **)(local_50._M_p + 8) = *(_func_int **)(local_50._M_p + 8) + 1;
      }
      local_58.mDat = (proxy *)local_50._M_p;
      copy((EVP_PKEY_CTX *)&local_78,(EVP_PKEY_CTX *)&local_58);
    }
    domain_manager::add_var_no_return<cs::var_id_const&>
              (&(this->super_runtime_type).storage,(var_id *)(ptVar1 + 1),&local_78,constant);
    cs_impl::any::recycle(&local_78);
    if (!link && !constant) {
      cs_impl::any::recycle(&local_58);
    }
    cs_impl::any::recycle((any *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void instance_type::parse_define_var(tree_type<token_base *>::iterator it, bool constant, bool link)
	{
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				parse_define_var(t.root(), constant, link);
		}
		else {
			token_base *root = it.data();
			switch (static_cast<token_signal *>(root)->get_signal()) {
			case signal_types::asi_: {
				const var &val = constant ? static_cast<token_value *>(it.right().data())->get_value() : parse_expr(
				                     it.right());
				storage.add_var_no_return(static_cast<token_id *>(it.left().data())->get_id(),
				                          constant || link ? val : copy(val),
				                          constant);
				break;
			}
			case signal_types::bind_: {
				parse_define_structured_binding(it, constant, link);
				break;
			}
			default:
				throw runtime_error("Wrong grammar for variable definition(6).");
			}
		}
	}